

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quit.cpp
# Opt level: O2

void pstore::http::quit(not_null<pstore::maybe<pstore::http::server_status,_void>_*> http_status)

{
  http_state hVar1;
  in_port_t iVar2;
  int iVar3;
  server_status *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  double __x;
  double __x_00;
  error_code eVar4;
  socket_descriptor fd;
  sockaddr local_68;
  not_null<const_char_*> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  not_null<const_char_*> local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if ((http_status.ptr_)->valid_ != true) {
    return;
  }
  this = maybe<pstore::http::server_status,_void>::operator->(http_status.ptr_);
  LOCK();
  hVar1 = (this->state_)._M_i;
  (this->state_)._M_i = closing;
  UNLOCK();
  if (hVar1 != listening) {
    return;
  }
  fd.fd_ = socket(2,1,0);
  if (fd.fd_ < 0) {
    eVar4 = get_last_error();
    (**(code **)(*(long *)eVar4._M_cat + 0x20))(&local_28,eVar4._M_cat,eVar4._M_value);
    log<std::__cxx11::string>(error,"Could not open socket: ",&local_28);
    this_00 = &local_28;
  }
  else {
    local_68.sa_data[6] = '\0';
    local_68.sa_data[7] = '\0';
    local_68.sa_data[8] = '\0';
    local_68.sa_data[9] = '\0';
    local_68.sa_data[10] = '\0';
    local_68.sa_data[0xb] = '\0';
    local_68.sa_data[0xc] = '\0';
    local_68.sa_data[0xd] = '\0';
    iVar2 = server_status::port(this);
    local_68.sa_data._0_2_ = iVar2 << 8 | iVar2 >> 8;
    local_68.sa_family = 2;
    local_68.sa_data[2] = '\x7f';
    local_68.sa_data[3] = '\0';
    local_68.sa_data[4] = '\0';
    local_68.sa_data[5] = '\x01';
    local_30.ptr_ = "Connecting";
    gsl::not_null<const_char_*>::ensure_invariant(&local_30);
    pstore::log((pstore *)0x6,__x);
    iVar3 = connect(fd.fd_,&local_68,0x10);
    if (iVar3 == 0) {
      local_58.ptr_ = "Connected";
      gsl::not_null<const_char_*>::ensure_invariant(&local_58);
      pstore::log((pstore *)0x6,__x_00);
      goto LAB_0014b3b9;
    }
    eVar4 = get_last_error();
    (**(code **)(*(long *)eVar4._M_cat + 0x20))(&local_50,eVar4._M_cat,eVar4._M_value);
    log<std::__cxx11::string>(error,"Could not connect to localhost: ",&local_50);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_0014b3b9:
  details::descriptor<pstore::details::posix_descriptor_traits>::~descriptor(&fd);
  return;
}

Assistant:

void quit (gsl::not_null<maybe<server_status> *> http_status) {
            if (!http_status->has_value ()) {
                return;
            }
            auto & s = **http_status;
            if (s.set_state_to_shutdown () == server_status::http_state::listening) {
                // The server was previously in the listening state so we must wake it up by
                // connecting.
                socket_descriptor const fd{::socket (AF_INET, SOCK_STREAM, IPPROTO_IP)};
                if (!fd.valid ()) {
                    log (logger::priority::error,
                         "Could not open socket: ", get_last_error ().message ());
                    return;
                }

                struct sockaddr_in sock_addr {};
                // NOLINTNEXTLINE
                sock_addr.sin_port = htons (s.port ()); //! OCLINT
                sock_addr.sin_family = AF_INET;
                // NOLINTNEXTLINE
                sock_addr.sin_addr.s_addr = htonl (INADDR_LOOPBACK); //! OCLINT

                log (logger::priority::info, "Connecting");

                if (::connect (fd.native_handle (),
                               reinterpret_cast<struct sockaddr *> (&sock_addr),
                               sizeof (sock_addr)) != 0) {
                    // Perhaps another connection happened before the one that we're attempting here
                    // and the server has already shutdown.
                    log (logger::priority::error,
                         "Could not connect to localhost: ", get_last_error ().message ());
                    return;
                }

                log (logger::priority::info, "Connected");
            }
        }